

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O2

expression * copy_expression(dmr_C *C,expression *expr)

{
  ptr_list *ppVar1;
  symbol *psVar2;
  symbol *__dest;
  expression *peVar3;
  expression *peVar4;
  expression *peVar5;
  expression *cast;
  undefined1 local_48 [8];
  ptr_list_iter argiter__;
  
  if (expr == (expression *)0x0) {
    return (expression *)0x0;
  }
  switch(*(undefined1 *)expr) {
  case 1:
  case 2:
  case 4:
  case 0x1c:
    break;
  case 3:
    psVar2 = copy_symbol(C,expr->pos,(expr->field_5).field_4.symbol);
    if (psVar2 == (symbol *)(expr->field_5).field_0.value) {
      return expr;
    }
    goto LAB_0011185f;
  case 5:
  case 7:
  case 0x15:
  case 0x16:
    peVar3 = copy_expression(C,(expr->field_5).field_3.unop);
    peVar4 = copy_expression(C,(expr->field_5).field_6.right);
LAB_001115ca:
    if ((peVar3 == (expression *)(expr->field_5).field_0.value) &&
       (peVar4 == (expression *)(expr->field_5).field_2.string)) {
      return expr;
    }
    goto LAB_0011189b;
  case 6:
    peVar3 = copy_expression(C,(expr->field_5).field_3.unop);
    peVar4 = copy_expression(C,(expr->field_5).field_6.right);
    if (expr->op == 0x3d) goto LAB_001115ca;
LAB_0011189b:
    expr = dup_expression(C,expr);
    (expr->field_5).field_3.unop = peVar3;
    (expr->field_5).field_6.right = peVar4;
    break;
  case 8:
  case 0x1d:
    psVar2 = (symbol *)copy_expression(C,(expr->field_5).field_3.unop);
    goto LAB_0011185f;
  case 9:
  case 10:
    psVar2 = (symbol *)copy_expression(C,(expr->field_5).field_3.unop);
    if ((symbol *)(expr->field_5).field_0.value == psVar2) {
      return expr;
    }
    goto LAB_0011185f;
  case 0xb:
    peVar3 = (expr->field_5).field_6.right;
    if (*(char *)peVar3 == '\x18') {
      psVar2 = (expr->field_5).field_4.symbol;
      peVar4 = dup_expression(C,expr);
      peVar3 = copy_expression(C,peVar3);
      (peVar4->field_5).field_6.right = peVar3;
      __dest = dmrC_alloc_symbol(C->S,psVar2->pos,(uint)*(byte *)psVar2);
      (peVar4->field_5).field_4.symbol = __dest;
      memcpy(__dest,psVar2,0xe8);
      return peVar4;
    }
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
    peVar3 = copy_expression(C,(expr->field_5).field_6.right);
    if (peVar3 == (expression *)(expr->field_5).field_2.string) {
      return expr;
    }
    goto LAB_00111680;
  case 0x11:
  case 0x12:
    peVar3 = copy_expression(C,(expr->field_5).field_3.unop);
    peVar4 = copy_expression(C,(expr->field_5).field_6.right);
    peVar5 = copy_expression(C,(expr->field_5).field_10.cond_false);
    if (((peVar3 != (expression *)(expr->field_5).field_0.value) ||
        (peVar4 != (expression *)(expr->field_5).field_2.string)) ||
       (peVar5 != (expr->field_5).field_10.cond_false)) {
      expr = dup_expression(C,expr);
      (expr->field_5).field_3.unop = peVar3;
      (expr->field_5).field_6.right = peVar4;
      (expr->field_5).field_10.cond_false = peVar5;
    }
    break;
  case 0x13:
    psVar2 = (symbol *)dmrC_alloc_statement(C,expr->pos,3);
    dmrC_copy_statement(C,(expr->field_5).statement,(statement *)psVar2);
    goto LAB_0011185f;
  case 0x14:
    peVar3 = copy_expression(C,(expr->field_5).field_3.unop);
    ppVar1 = (ptr_list *)(expr->field_5).field_2.string;
    expr = dup_expression(C,expr);
    (expr->field_5).field_3.unop = peVar3;
    (expr->field_5).field_2.string = (string *)0x0;
    ptrlist_forward_iterator((ptr_list_iter *)local_48,ppVar1);
    peVar3 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_48);
    while (peVar3 != (expression *)0x0) {
      peVar3 = copy_expression(C,peVar3);
      ptrlist_add((ptr_list **)&(expr->field_5).field_2.string,peVar3,&C->ptrlist_allocator);
      peVar3 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_48);
    }
    break;
  case 0x17:
    psVar2 = copy_symbol(C,expr->pos,(expr->field_5).field_4.symbol);
LAB_0011185f:
    expr = dup_expression(C,expr);
    (expr->field_5).statement = (statement *)psVar2;
    break;
  case 0x18:
    ppVar1 = (ptr_list *)(expr->field_5).field_3.unop;
    expr = dup_expression(C,expr);
    (expr->field_5).field_0.value = 0;
    ptrlist_forward_iterator((ptr_list_iter *)local_48,ppVar1);
    peVar3 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_48);
    while (peVar3 != (expression *)0x0) {
      peVar3 = copy_expression(C,peVar3);
      ptrlist_add((ptr_list **)&(expr->field_5).statement,peVar3,&C->ptrlist_allocator);
      peVar3 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_48);
    }
    break;
  case 0x19:
    peVar3 = copy_expression(C,(expr->field_5).field_14.ident_expression);
    expr = dup_expression(C,expr);
    (expr->field_5).field_14.ident_expression = peVar3;
    break;
  case 0x1a:
  case 0x1b:
    peVar3 = copy_expression(C,(expr->field_5).field_6.right);
    goto LAB_00111680;
  case 0x1e:
    peVar3 = copy_expression(C,(expr->field_5).field_6.right);
    if (expr->op != 0x2e) {
      peVar4 = copy_expression(C,(expr->field_5).field_10.cond_false);
      if (((expression *)(expr->field_5).field_2.string == peVar3) &&
         ((expr->field_5).field_10.cond_false == peVar4)) {
        return expr;
      }
      peVar5 = dup_expression(C,expr);
      (peVar5->field_5).field_6.right = peVar3;
      (peVar5->field_5).field_10.cond_false = peVar4;
      return peVar5;
    }
    if ((expression *)(expr->field_5).field_2.string == peVar3) {
      return expr;
    }
LAB_00111680:
    expr = dup_expression(C,expr);
    (expr->field_5).field_6.right = peVar3;
    break;
  default:
    dmrC_warning(C,expr->pos,"trying to copy expression type %d");
  }
  return expr;
}

Assistant:

static struct expression * copy_expression(struct dmr_C *C, struct expression *expr)
{
	if (!expr)
		return NULL;

	switch (expr->type) {
	/*
	 * EXPR_SYMBOL is the interesting case, we may need to replace the
	 * symbol to the new copy.
	 */
	case EXPR_SYMBOL: {
		struct symbol *sym = copy_symbol(C, expr->pos, expr->symbol);
		if (sym == expr->symbol)
			break;
		expr = dup_expression(C, expr);
		expr->symbol = sym;
		break;
	}

	/* Atomics, never change, just return the expression directly */
	case EXPR_VALUE:
	case EXPR_STRING:
	case EXPR_FVALUE:
	case EXPR_TYPE:
		break;

	/* Unops: check if the subexpression is unique */
	case EXPR_PREOP:
	case EXPR_POSTOP: {
		struct expression *unop = copy_expression(C, expr->unop);
		if (expr->unop == unop)
			break;
		expr = dup_expression(C, expr);
		expr->unop = unop;
		break;
	}

	case EXPR_SLICE: {
		struct expression *base = copy_expression(C, expr->base);
		expr = dup_expression(C, expr);
		expr->base = base;
		break;
	}

	/* Binops: copy left/right expressions */
	case EXPR_BINOP:
	case EXPR_COMMA:
	case EXPR_COMPARE:
	case EXPR_LOGICAL: {
		struct expression *left = copy_expression(C, expr->left);
		struct expression *right = copy_expression(C, expr->right);
		if (left == expr->left && right == expr->right)
			break;
		expr = dup_expression(C, expr);
		expr->left = left;
		expr->right = right;
		break;
	}

	case EXPR_ASSIGNMENT: {
		struct expression *left = copy_expression(C, expr->left);
		struct expression *right = copy_expression(C, expr->right);
		if (expr->op == '=' && left == expr->left && right == expr->right)
			break;
		expr = dup_expression(C, expr);
		expr->left = left;
		expr->right = right;
		break;
	}

	/* Dereference */
	case EXPR_DEREF: {
		struct expression *deref = copy_expression(C, expr->deref);
		expr = dup_expression(C, expr);
		expr->deref = deref;
		break;
	}

	/* Cast/sizeof/__alignof__ */
	case EXPR_CAST:
		if (expr->cast_expression->type == EXPR_INITIALIZER) {
			struct expression *cast = expr->cast_expression;
			struct symbol *sym = expr->cast_type;
			expr = dup_expression(C, expr);
			expr->cast_expression = copy_expression(C, cast);
			expr->cast_type = dmrC_alloc_symbol(C->S, sym->pos, sym->type);
			*expr->cast_type = *sym;
			break;
		}
	case EXPR_FORCE_CAST:
	case EXPR_IMPLIED_CAST:
	case EXPR_SIZEOF: 
	case EXPR_PTRSIZEOF:
	case EXPR_ALIGNOF: {
		struct expression *cast = copy_expression(C, expr->cast_expression);
		if (cast == expr->cast_expression)
			break;
		expr = dup_expression(C, expr);
		expr->cast_expression = cast;
		break;
	}

	/* Conditional expression */
	case EXPR_SELECT:
	case EXPR_CONDITIONAL: {
		struct expression *cond = copy_expression(C, expr->conditional);
		struct expression *truee = copy_expression(C, expr->cond_true);
		struct expression *falsee = copy_expression(C, expr->cond_false);
		if (cond == expr->conditional && truee == expr->cond_true && falsee == expr->cond_false)
			break;
		expr = dup_expression(C, expr);
		expr->conditional = cond;
		expr->cond_true = truee;
		expr->cond_false = falsee;
		break;
	}

	/* Statement expression */
	case EXPR_STATEMENT: {
		struct statement *stmt = dmrC_alloc_statement(C, expr->pos, STMT_COMPOUND);
		dmrC_copy_statement(C, expr->statement, stmt);
		expr = dup_expression(C, expr);
		expr->statement = stmt;
		break;
	}

	/* Call expression */
	case EXPR_CALL: {
		struct expression *fn = copy_expression(C, expr->fn);
		struct expression_list *list = expr->args;
		struct expression *arg;

		expr = dup_expression(C, expr);
		expr->fn = fn;
		expr->args = NULL;
		FOR_EACH_PTR(list, arg) {
			dmrC_add_expression(C, &expr->args, copy_expression(C, arg));
		} END_FOR_EACH_PTR(arg);
		break;
	}

	/* Initializer list statement */
	case EXPR_INITIALIZER: {
		struct expression_list *list = expr->expr_list;
		struct expression *entry;
		expr = dup_expression(C, expr);
		expr->expr_list = NULL;
		FOR_EACH_PTR(list, entry) {
			dmrC_add_expression(C, &expr->expr_list, copy_expression(C, entry));
		} END_FOR_EACH_PTR(entry);
		break;
	}

	/* Label in inline function - hmm. */
	case EXPR_LABEL: {
		struct symbol *label_symbol = copy_symbol(C, expr->pos, expr->label_symbol);
		expr = dup_expression(C, expr);
		expr->label_symbol = label_symbol;
		break;
	}

	case EXPR_INDEX: {
		struct expression *sub_expr = copy_expression(C, expr->idx_expression);
		expr = dup_expression(C, expr);
		expr->idx_expression = sub_expr;
		break;
	}
		
	case EXPR_IDENTIFIER: {
		struct expression *sub_expr = copy_expression(C, expr->ident_expression);
		expr = dup_expression(C, expr);
		expr->ident_expression = sub_expr;
		break;
	}

	/* Position in initializer.. */
	case EXPR_POS: {
		struct expression *val = copy_expression(C, expr->init_expr);
		expr = dup_expression(C, expr);
		expr->init_expr = val;
		break;
	}
	case EXPR_OFFSETOF: {
		struct expression *val = copy_expression(C, expr->down);
		if (expr->op == '.') {
			if (expr->down != val) {
				expr = dup_expression(C, expr);
				expr->down = val;
			}
		} else {
			struct expression *idx = copy_expression(C, expr->index);
			if (expr->down != val || expr->index != idx) {
				expr = dup_expression(C, expr);
				expr->down = val;
				expr->index = idx;
			}
		}
		break;
	}
	default:
		dmrC_warning(C, expr->pos, "trying to copy expression type %d", expr->type);
	}
	return expr;
}